

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

Aig_Man_t *
LivenessToSafetyTransformationAbs
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair
          ,Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  ulong uVar1;
  Vec_Ptr_t *p_00;
  Aig_Man_t *p_01;
  size_t sVar2;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  Aig_Obj_t *local_98;
  Aig_Obj_t *local_88;
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_60;
  
  vecPis = Vec_PtrAlloc(p->nTruePis + 1);
  vecPiNames = Vec_PtrAlloc(p->nTruePis + 1);
  vecLos = Vec_PtrAlloc(vFair->nSize + p->nRegs + vFlops->nSize + vLive->nSize + 1);
  vecLoNames = Vec_PtrAlloc(vFair->nSize + p->nRegs + vFlops->nSize + vLive->nSize + 1);
  p_01 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar7 = pNtk->pName;
  sVar2 = strlen(pcVar7);
  pcVar3 = (char *)malloc(sVar2 + 5);
  p_01->pName = pcVar3;
  sprintf(pcVar3,"%s_%s",pcVar7);
  p_01->pSpec = (char *)0x0;
  pAVar4 = p->pConst1;
  pAVar4->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_01->pConst1;
  for (iVar15 = 0; iVar15 < p->nTruePis; iVar15 = iVar15 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar15);
    pAVar5 = Aig_ObjCreateCi(p_01);
    (pAVar4->field_5).pData = pAVar5;
    Vec_PtrPush(vecPis,pAVar5);
    pAVar6 = Abc_NtkPi(pNtk,iVar15);
    pcVar7 = Abc_ObjName(pAVar6);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecPiNames,pcVar7);
  }
  iVar15 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    pAVar5 = Aig_ObjCreateCi(p_01);
    Vec_PtrPush(vecPiNames,"SAVE_BIERE");
  }
  else {
    pAVar5 = (Aig_Obj_t *)0x0;
  }
  for (; iVar15 < p->nRegs; iVar15 = iVar15 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar15);
    pAVar8 = Aig_ObjCreateCi(p_01);
    (pAVar4->field_5).pData = pAVar8;
    Vec_PtrPush(vecLos,pAVar8);
    pAVar6 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + iVar15);
    pcVar7 = Abc_ObjName(pAVar6);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecLoNames,pcVar7);
  }
  iVar15 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    local_60 = Aig_ObjCreateCi(p_01);
    Vec_PtrPush(vecLos,local_60);
    Vec_PtrPush(vecLoNames,"SAVED_LO");
    local_68 = Aig_Or(p_01,pAVar5,local_60);
    local_88 = Aig_And(p_01,pAVar5,(Aig_Obj_t *)((ulong)local_60 ^ 1));
  }
  else {
    local_60 = (Aig_Obj_t *)0x0;
    local_88 = (Aig_Obj_t *)0x0;
    local_68 = (Aig_Obj_t *)0x0;
  }
  for (; iVar15 < p->vObjs->nSize; iVar15 = iVar15 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar15);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      pAVar8 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_01,pAVar5,pAVar8);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  if ((uint)mode < 2) {
    iVar15 = vAssertSafety->nSize;
    if (iVar15 == 0) {
      puts("WARNING!! No safety property is found, a new (negated) constant 1 output is created");
      pAVar5 = (Aig_Obj_t *)((ulong)p_01->pConst1 ^ 1);
    }
    else {
      pAVar5 = p_01->pConst1;
      if (vAssumeSafety->nSize == 0) {
        for (iVar16 = 0; iVar16 < iVar15; iVar16 = iVar16 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar16);
          pAVar5 = Aig_And(p_01,(Aig_Obj_t *)
                                ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                                *(ulong *)(((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                           pAVar5);
          iVar15 = vAssertSafety->nSize;
        }
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
      else {
        for (iVar16 = 0; iVar16 < iVar15; iVar16 = iVar16 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar16);
          pAVar5 = Aig_And(p_01,(Aig_Obj_t *)
                                ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                                *(ulong *)(((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                           pAVar5);
          iVar15 = vAssertSafety->nSize;
        }
        pAVar8 = p_01->pConst1;
        for (iVar15 = 0; iVar15 < vAssumeSafety->nSize; iVar15 = iVar15 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,iVar15);
          pAVar8 = Aig_And(p_01,(Aig_Obj_t *)
                                ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                                *(ulong *)(((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                           pAVar8);
        }
        pAVar5 = Aig_And(p_01,(Aig_Obj_t *)((ulong)pAVar5 ^ 1),pAVar8);
      }
    }
    Aig_ObjCreateCo(p_01,pAVar5);
  }
  iVar15 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    pAVar4 = Aig_ObjCreateCo(p_01,*(Aig_Obj_t **)
                                   (((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) + 0x28));
  }
  else {
    pAVar4 = (Aig_Obj_t *)0x0;
    iVar15 = 0;
  }
  for (; iVar15 < p->nRegs; iVar15 = iVar15 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar15);
    pAVar5 = Saig_ObjLoToLi(p,pAVar5);
    Aig_ObjCreateCo(p_01,(Aig_Obj_t *)
                         ((ulong)((uint)pAVar5->pFanin0 & 1) ^
                         *(ulong *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28)));
  }
  if ((mode & 0xfffffffdU) == 0) {
    pAVar5 = Aig_ObjCreateCo(p_01,local_68);
    local_98 = p_01->pConst1;
    for (uVar17 = 0; (int)uVar17 < p->nRegs; uVar17 = uVar17 + 1) {
      Vec_PtrEntry(p->vCis,p->nTruePis + uVar17);
      pAVar6 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + uVar17);
      pcVar7 = Abc_ObjName(pAVar6);
      printf("Flop[%d] = %s\n",(ulong)uVar17,pcVar7);
    }
    iVar16 = iVar15;
    for (lVar13 = 0; iVar15 = iVar16 + 1, lVar13 < vFlops->nSize; lVar13 = lVar13 + 1) {
      uVar17 = vFlops->pArray[lVar13];
      pAVar8 = Aig_ObjCreateCi(p_01);
      pvVar9 = Vec_PtrEntry(p->vCis,(p->nObjs[2] + uVar17) - p->nRegs);
      Vec_PtrPush(vecLos,pAVar8);
      pAVar6 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + uVar17);
      pcVar7 = Abc_ObjName(pAVar6);
      sVar2 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar2 + 10);
      pAVar6 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + uVar17);
      pcVar3 = Abc_ObjName(pAVar6);
      sprintf(pcVar7,"%s__%s",pcVar3,"SHADOW");
      printf("Flop copied [%d] = %s\n",(ulong)uVar17,pcVar7);
      Vec_PtrPush(vecLoNames,pcVar7);
      pAVar10 = Aig_Mux(p_01,local_88,*(Aig_Obj_t **)((long)pvVar9 + 0x28),pAVar8);
      Aig_ObjCreateCo(p_01,pAVar10);
      pAVar8 = Aig_Exor(p_01,*(Aig_Obj_t **)((long)pvVar9 + 0x28),pAVar8);
      local_98 = Aig_And(p_01,(Aig_Obj_t *)((ulong)pAVar8 ^ 1),local_98);
      iVar16 = iVar15;
    }
    pAVar8 = Aig_And(p_01,local_60,local_98);
    local_70 = p_01->pConst1;
    if ((vLive == (Vec_Ptr_t *)0x0) || (iVar18 = vLive->nSize, iVar18 == 0)) {
      puts("Circuit without any liveness property");
      iVar14 = 1;
    }
    else {
      for (iVar14 = 1; iVar14 + -1 < iVar18; iVar14 = iVar14 + 1) {
        pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(vLive,iVar14 + -1);
        pAVar10 = pAVar11->pFanin0;
        uVar1 = *(ulong *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x28);
        pAVar12 = Aig_ObjCreateCi(p_01);
        Vec_PtrPush(vecLos,pAVar12);
        iVar15 = getPoIndex(p,pAVar11);
        pAVar6 = Abc_NtkPo(pNtk,iVar15);
        pcVar7 = Abc_ObjName(pAVar6);
        sVar2 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar2 + 0xc);
        iVar15 = getPoIndex(p,pAVar11);
        pAVar6 = Abc_NtkPo(pNtk,iVar15);
        pcVar3 = Abc_ObjName(pAVar6);
        sprintf(pcVar7,"%s__%s",pcVar3,"LIVENESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar10 = Aig_And(p_01,(Aig_Obj_t *)((uint)pAVar10 & 1 ^ uVar1),local_68);
        pAVar10 = Aig_Or(p_01,pAVar12,pAVar10);
        Aig_ObjCreateCo(p_01,pAVar10);
        local_70 = Aig_And(p_01,pAVar12,local_70);
        iVar18 = vLive->nSize;
      }
      iVar15 = iVar16 + iVar14;
    }
    local_88 = p_01->pConst1;
    if ((vFair == (Vec_Ptr_t *)0x0) || (iVar16 = vFair->nSize, iVar16 == 0)) {
      puts("Circuit without any fairness property");
      iVar18 = 0;
    }
    else {
      for (iVar18 = 0; iVar18 < iVar16; iVar18 = iVar18 + 1) {
        pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(vFair,iVar18);
        pAVar10 = pAVar11->pFanin0;
        uVar1 = *(ulong *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x28);
        pAVar12 = Aig_ObjCreateCi(p_01);
        Vec_PtrPush(vecLos,pAVar12);
        iVar16 = getPoIndex(p,pAVar11);
        pAVar6 = Abc_NtkPo(pNtk,iVar16);
        pcVar7 = Abc_ObjName(pAVar6);
        sVar2 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar2 + 0xc);
        iVar16 = getPoIndex(p,pAVar11);
        pAVar6 = Abc_NtkPo(pNtk,iVar16);
        pcVar3 = Abc_ObjName(pAVar6);
        sprintf(pcVar7,"%s__%s",pcVar3,"FAIRNESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar10 = Aig_And(p_01,(Aig_Obj_t *)((uint)pAVar10 & 1 ^ uVar1),local_68);
        pAVar10 = Aig_Or(p_01,pAVar12,pAVar10);
        Aig_ObjCreateCo(p_01,pAVar10);
        local_88 = Aig_And(p_01,pAVar12,local_88);
        iVar16 = vFair->nSize;
      }
      iVar15 = iVar15 + iVar18;
    }
    pAVar10 = Aig_And(p_01,local_88,(Aig_Obj_t *)((ulong)local_70 ^ 1));
    pAVar8 = Aig_And(p_01,pAVar8,pAVar10);
    Aig_ObjPatchFanin0(p_01,pAVar4,pAVar8);
  }
  else {
    pAVar5 = (Aig_Obj_t *)0x0;
    iVar14 = 1;
    iVar18 = 0;
  }
  Aig_ManSetRegNum(p_01,iVar15);
  Aig_ManCiCleanupBiere(p_01);
  Aig_ManCoCleanupBiere(p_01);
  Aig_ManCleanup(p_01);
  iVar15 = Aig_ManCheck(p_01);
  if (iVar15 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x33d,
                  "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((mode & 0xfffffffdU) == 0) {
    p_00 = p_01->vCos;
    iVar15 = p_01->nTruePos;
    iVar16 = Aig_ObjCioId(local_60);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,~p->nTruePis + iVar15 + iVar16);
    if (pAVar4 != pAVar5) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x341,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePis + 1 != p_01->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x342,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p_01->nRegs != iVar14 + iVar18 + p->nRegs + vFlops->nSize) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x343,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return p_01;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationAbs( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, Vec_Int_t *vFlops, 
                                           Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
    Aig_Man_t * pNew;
    int i, nRegCount, iEntry;
    Aig_Obj_t * pObjSavePi = NULL;
    Aig_Obj_t *pObjSavedLi = NULL, *pObjSavedLo = NULL;
    Aig_Obj_t *pObj, *pMatch;
    Aig_Obj_t *pObjSavedLoAndEquality, *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL;
    Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
    Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
    Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
    Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
    Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
    char *nodeName;
    int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0, fairLatch = 0;//, piVecIndex = 0;
    
    vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
    vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

    vecLos = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
    vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

    //****************************************************************
    // Step1: create the new manager
    // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
    // nodes, but this selection is arbitrary - need to be justified
    //****************************************************************
    pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
    pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l2s") + 1 );
    sprintf(pNew->pName, "%s_%s", pNtk->pName, "l2s");
    pNew->pSpec = NULL;
    
    //****************************************************************
    // Step 2: map constant nodes
    //****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

    //****************************************************************
    // Step 3: create true PIs
    //****************************************************************
    Saig_ManForEachPi( p, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecPis, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
        Vec_PtrPush( vecPiNames, nodeName );
    }

    //****************************************************************
    // Step 4: create the special Pi corresponding to SAVE
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSavePi = Aig_ObjCreateCi( pNew );
        nodeName = "SAVE_BIERE",
        Vec_PtrPush( vecPiNames, nodeName );
    }
        
    //****************************************************************
    // Step 5: create register outputs
    //****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecLos, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 6: create "saved" register output
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        loCreated++;
        pObjSavedLo = Aig_ObjCreateCi( pNew );
        Vec_PtrPush( vecLos, pObjSavedLo );
        nodeName = "SAVED_LO";
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
        pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
    }

    //********************************************************************
    // Step 8: create internal nodes
    //********************************************************************
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }

    
    //********************************************************************
    // Step 8.x : create PO for each safety assertions
    // NOTE : Here the output is purposely inverted as it will be thrown to 
    // dprove
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
    {
        if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
        }
        else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssertSafety = pObjAndAcc;

            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssumeSafety = pObjAndAcc;
            Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
        }
        else
        {
            printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
            Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
        }
    }

    //********************************************************************
    // Step 9: create the safety property output gate for the liveness properties
    // discuss with Sat/Alan for an alternative implementation
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
    }

    // create register inputs for the original registers
    nRegCount = 0;
    
    Saig_ManForEachLo( p, pObj, i )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
        liCopied++;
    }

    // create register input corresponding to the register "saved"
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        #ifndef DUPLICATE_CKT_DEBUG
            pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
            nRegCount++;
            liCreated++;

            //Changed on October 13, 2009
            //pObjAndAcc = NULL;
            pObjAndAcc = Aig_ManConst1( pNew );

    // create the family of shadow registers, then create the cascade of Xnor and And gates for the comparator 
            //Saig_ManForEachLo( p, pObj, i )
            Saig_ManForEachLo( p, pObj, i )
            {
                printf("Flop[%d] = %s\n", i, Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) );
            }
            Vec_IntForEachEntry( vFlops, iEntry, i )
            {
                pObjShadowLo = Aig_ObjCreateCi( pNew );
                pObj = Aig_ManLo( p, iEntry );

                #ifdef PROPAGATE_NAMES
                    Vec_PtrPush( vecLos, pObjShadowLo );
                    nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ) ) + 10 );
                    sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ), "SHADOW" );
                    printf("Flop copied [%d] = %s\n", iEntry, nodeName );
                    Vec_PtrPush( vecLoNames, nodeName );
                #endif

                pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                nRegCount++;
                loCreated++; liCreated++;
        
                pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjXnor = Aig_Not( pObjXor );
                
                pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
            }

            // create the AND gate whose output will be the signal "looped"
            pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

            // create the master AND gate and corresponding AND and OR logic for the liveness properties
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
            {
                printf("Circuit without any liveness property\n");
            }
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
                {
                    liveLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjLive = pObjAndAcc;
                
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
                printf("Circuit without any fairness property\n");
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
                {
                    fairLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "FAIRNESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjFair = pObjAndAcc;
                
            //pObjSafetyGate = Aig_Exor( pNew, Aig_Not(Aig_ManConst1( pNew )), Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) ) );
            //Following is the actual Biere translation
            pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );

            Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
        #endif
    }

    Aig_ManSetRegNum( pNew, nRegCount );

    Aig_ManCiCleanupBiere( pNew );
    Aig_ManCoCleanupBiere( pNew );
    
    Aig_ManCleanup( pNew );
    
    assert( Aig_ManCheck( pNew ) );
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
            assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
            assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
            assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch );
    }

    return pNew;
}